

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Textures.cpp
# Opt level: O2

SP __thiscall pbrt::SemanticParser::createTexture_mix(SemanticParser *this,SP *in)

{
  long lVar1;
  undefined8 uVar2;
  bool bVar3;
  long *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  float fVar4;
  SP SVar5;
  SP tex;
  allocator<char> local_a9;
  string local_a8;
  undefined1 local_88 [88];
  
  std::make_shared<pbrt::MixTexture>();
  lVar1 = *in_RDX;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"amount",(allocator<char> *)local_88);
  bVar3 = syntactic::ParamSet::hasParam3f((ParamSet *)(lVar1 + 8),&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  uVar2 = local_88._16_8_;
  lVar1 = *in_RDX;
  if (bVar3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"amount",(allocator<char> *)local_88);
    syntactic::ParamSet::getParam3f
              ((ParamSet *)(lVar1 + 8),
               (float *)&(((vector<std::shared_ptr<pbrt::syntactic::Camera>,_std::allocator<std::shared_ptr<pbrt::syntactic::Camera>_>_>
                            *)(uVar2 + 8))->
                         super__Vector_base<std::shared_ptr<pbrt::syntactic::Camera>,_std::allocator<std::shared_ptr<pbrt::syntactic::Camera>_>_>
                         )._M_impl.super__Vector_impl_data._M_end_of_storage,&local_a8);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"amount",(allocator<char> *)local_88);
    bVar3 = syntactic::ParamSet::hasParam1f((ParamSet *)(lVar1 + 8),&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    if (bVar3) {
      lVar1 = *in_RDX;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"amount",(allocator<char> *)local_88);
      fVar4 = syntactic::ParamSet::getParam1f((ParamSet *)(lVar1 + 8),&local_a8,0.0);
      *(float *)&(((vector<std::shared_ptr<pbrt::syntactic::Camera>,_std::allocator<std::shared_ptr<pbrt::syntactic::Camera>_>_>
                    *)(local_88._16_8_ + 8))->
                 super__Vector_base<std::shared_ptr<pbrt::syntactic::Camera>,_std::allocator<std::shared_ptr<pbrt::syntactic::Camera>_>_>
                 )._M_impl.super__Vector_impl_data._M_end_of_storage = fVar4;
      *(float *)((long)&(((vector<std::shared_ptr<pbrt::syntactic::Camera>,_std::allocator<std::shared_ptr<pbrt::syntactic::Camera>_>_>
                           *)(local_88._16_8_ + 8))->
                        super__Vector_base<std::shared_ptr<pbrt::syntactic::Camera>,_std::allocator<std::shared_ptr<pbrt::syntactic::Camera>_>_>
                        )._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = fVar4;
      *(float *)&(((shared_ptr<pbrt::syntactic::Film> *)(local_88._16_8_ + 0x20))->
                 super___shared_ptr<pbrt::syntactic::Film,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           fVar4;
    }
    else {
      lVar1 = *in_RDX;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"amount",&local_a9);
      syntactic::ParamSet::getParamTexture((ParamSet *)(local_88 + 0x48),(string *)(lVar1 + 8));
      findOrCreateTexture((SemanticParser *)local_88,in);
      std::__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2> *)
                 &(((shared_ptr<pbrt::syntactic::Film> *)(local_88._16_8_ + 0x20))->
                  super___shared_ptr<pbrt::syntactic::Film,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
                 ,(__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2> *)local_88);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 0x50));
    }
  }
  std::__cxx11::string::~string((string *)&local_a8);
  lVar1 = *in_RDX;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"tex1",(allocator<char> *)local_88);
  bVar3 = syntactic::ParamSet::hasParamTexture((ParamSet *)(lVar1 + 8),&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  if (bVar3) {
    lVar1 = *in_RDX;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"tex1",&local_a9);
    syntactic::ParamSet::getParamTexture((ParamSet *)(local_88 + 0x38),(string *)(lVar1 + 8));
    findOrCreateTexture((SemanticParser *)local_88,in);
    std::__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2> *)
               &(((SP *)(local_88._16_8_ + 0x30))->
                super___shared_ptr<pbrt::Film,_(__gnu_cxx::_Lock_policy)2>)._M_refcount,
               (__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2> *)local_88);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 0x40));
  }
  else {
    lVar1 = *in_RDX;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"tex1",(allocator<char> *)local_88);
    bVar3 = syntactic::ParamSet::hasParam3f((ParamSet *)(lVar1 + 8),&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    uVar2 = local_88._16_8_;
    lVar1 = *in_RDX;
    if (bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"tex1",(allocator<char> *)local_88);
      syntactic::ParamSet::getParam3f
                ((ParamSet *)(lVar1 + 8),
                 (float *)&(((SP *)(uVar2 + 0x50))->
                           super___shared_ptr<pbrt::Integrator,_(__gnu_cxx::_Lock_policy)2>).
                           _M_refcount,&local_a8);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"tex1",(allocator<char> *)local_88);
      fVar4 = syntactic::ParamSet::getParam1f((ParamSet *)(lVar1 + 8),&local_a8,0.0);
      *(float *)&(((SP *)(local_88._16_8_ + 0x50))->
                 super___shared_ptr<pbrt::Integrator,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
           = fVar4;
      *(float *)((long)&(((SP *)(local_88._16_8_ + 0x50))->
                        super___shared_ptr<pbrt::Integrator,_(__gnu_cxx::_Lock_policy)2>).
                        _M_refcount._M_pi + 4) = fVar4;
      *(float *)&(((SP *)(local_88._16_8_ + 0x60))->
                 super___shared_ptr<pbrt::PixelFilter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = fVar4;
    }
  }
  std::__cxx11::string::~string((string *)&local_a8);
  lVar1 = *in_RDX;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"tex2",(allocator<char> *)local_88);
  bVar3 = syntactic::ParamSet::hasParamTexture((ParamSet *)(lVar1 + 8),&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  if (bVar3) {
    lVar1 = *in_RDX;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"tex2",&local_a9);
    syntactic::ParamSet::getParamTexture((ParamSet *)(local_88 + 0x28),(string *)(lVar1 + 8));
    findOrCreateTexture((SemanticParser *)local_88,in);
    std::__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2> *)
               &(((SP *)(local_88._16_8_ + 0x40))->
                super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>)._M_refcount,
               (__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2> *)local_88);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 0x30));
  }
  else {
    lVar1 = *in_RDX;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"tex2",(allocator<char> *)local_88);
    bVar3 = syntactic::ParamSet::hasParam3f((ParamSet *)(lVar1 + 8),&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    uVar2 = local_88._16_8_;
    lVar1 = *in_RDX;
    if (bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"tex2",(allocator<char> *)local_88);
      syntactic::ParamSet::getParam3f
                ((ParamSet *)(lVar1 + 8),
                 (float *)((long)&(((SP *)(uVar2 + 0x60))->
                                  super___shared_ptr<pbrt::PixelFilter,_(__gnu_cxx::_Lock_policy)2>)
                                  ._M_ptr + 4),&local_a8);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"tex2",(allocator<char> *)local_88);
      fVar4 = syntactic::ParamSet::getParam1f((ParamSet *)(lVar1 + 8),&local_a8,0.0);
      *(float *)((long)&(((SP *)(local_88._16_8_ + 0x60))->
                        super___shared_ptr<pbrt::PixelFilter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
                4) = fVar4;
      *(float *)&(((SP *)(local_88._16_8_ + 0x60))->
                 super___shared_ptr<pbrt::PixelFilter,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                 _M_pi = fVar4;
      *(float *)((long)&(((SP *)(local_88._16_8_ + 0x60))->
                        super___shared_ptr<pbrt::PixelFilter,_(__gnu_cxx::_Lock_policy)2>).
                        _M_refcount._M_pi + 4) = fVar4;
    }
  }
  std::__cxx11::string::~string((string *)&local_a8);
  uVar2 = local_88._24_8_;
  local_88._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_88._16_8_;
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2;
  local_88._16_8_ = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 0x18));
  SVar5.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  SVar5.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (SP)SVar5.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Texture::SP SemanticParser::createTexture_mix(pbrt::syntactic::Texture::SP in)
  {
    MixTexture::SP tex = std::make_shared<MixTexture>();

    if (in->hasParam3f("amount"))
      in->getParam3f(&tex->amount.x,"amount");
    else if (in->hasParam1f("amount"))
      tex->amount = vec3f(in->getParam1f("amount"));
    else 
      tex->map_amount = findOrCreateTexture(in->getParamTexture("amount"));
          
    if (in->hasParamTexture("tex1"))
      tex->tex1 = findOrCreateTexture(in->getParamTexture("tex1"));
    else if (in->hasParam3f("tex1"))
      in->getParam3f(&tex->scale1.x,"tex1");
    else
      tex->scale1 = vec3f(in->getParam1f("tex1"));
          
    if (in->hasParamTexture("tex2"))
      tex->tex2 = findOrCreateTexture(in->getParamTexture("tex2"));
    else if (in->hasParam3f("tex2"))
      in->getParam3f(&tex->scale2.x,"tex2");
    else
      tex->scale2 = vec3f(in->getParam1f("tex2"));
    return tex;
  }